

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UBool ures_cleanup(void)

{
  UResourceDataEntry *entry;
  bool bVar1;
  UHashElement *e;
  int32_t pos;
  int32_t local_1c;
  
  if (cache != (UHashtable *)0x0) {
    umtx_lock_63(&resbMutex);
    if (cache != (UHashtable *)0x0) {
      do {
        local_1c = -1;
        e = uhash_nextElement_63(cache,&local_1c);
        if (e == (UHashElement *)0x0) break;
        bVar1 = false;
        do {
          entry = (UResourceDataEntry *)(e->value).pointer;
          if (entry->fCountExisting == 0) {
            uhash_removeElement_63(cache,e);
            free_entry(entry);
            bVar1 = true;
          }
          e = uhash_nextElement_63(cache,&local_1c);
        } while (e != (UHashElement *)0x0);
      } while (bVar1);
    }
    umtx_unlock_63(&resbMutex);
    uhash_close_63(cache);
    cache = (UHashtable *)0x0;
  }
  LOCK();
  gCacheInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

static UBool U_CALLCONV ures_cleanup(void)
{
    if (cache != NULL) {
        ures_flushCache();
        uhash_close(cache);
        cache = NULL;
    }
    gCacheInitOnce.reset();
    return TRUE;
}